

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O2

void __thiscall VgaDebugGenerator::LoadTemplate(VgaDebugGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *this_00;
  allocator<char> local_259;
  optional<Template> temp_opt;
  ifstream temp_fin;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&temp_fin,(string *)this,_S_in);
  if ((abStack_200[*(long *)(_temp_fin + -0x18)] & 5) != 0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp_opt,
                   "Failed to open template file \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&temp_opt,
                   "\'");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  Template::From(&temp_opt,&temp_fin,(this->config).header_lines,(this->config).template_width,
                 (this->config).template_height);
  if (temp_opt.super__Optional_base<Template,_false,_false>._M_payload.
      super__Optional_payload<Template,_true,_false,_false>.super__Optional_payload_base<Template>.
      _M_engaged != false) {
    Template::operator=(&this->templte,(Template *)&temp_opt);
    std::_Optional_payload_base<Template>::_M_reset((_Optional_payload_base<Template> *)&temp_opt);
    std::ifstream::~ifstream(&temp_fin);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,"Failed to parse template file due to above reasons",&local_259);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void VgaDebugGenerator::LoadTemplate() {
    std::ifstream temp_fin(config.template_file);
    if (!temp_fin) {
        throw "Failed to open template file '" + config.template_file + "'";
    }
    auto temp_opt = Template::From(temp_fin, config.header_lines, config.template_width, config.template_height);
    if (!temp_opt.has_value()) {
        throw std::string("Failed to parse template file due to above reasons");
    }
    templte = temp_opt.value();
}